

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_decorator.hpp
# Opt level: O1

void __thiscall ftxui::NodeDecorator::NodeDecorator(NodeDecorator *this,Element *child)

{
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  Elements local_20;
  
  local_30 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  unpack<std::shared_ptr<ftxui::Node>>
            (&local_20,(ftxui *)&local_30,(shared_ptr<ftxui::Node> *)local_28);
  Node::Node(&this->super_Node,&local_20);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_20);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00176678;
  return;
}

Assistant:

NodeDecorator(Element child) : Node(unpack(std::move(child))) {}